

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

QAMSet * __thiscall OSTEI_HRR_Algorithm_Base::GetIntermediates(OSTEI_HRR_Algorithm_Base *this)

{
  bool bVar1;
  value_type *__x;
  long in_RSI;
  QAMSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<QAM>,_bool> pVar2;
  QAM *it;
  const_iterator __end1;
  const_iterator __begin1;
  QAMList *__range1;
  QAMSet *ret;
  QAM *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  _Rb_tree_const_iterator<QAM> in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QAMSet *this_00;
  __normal_iterator<const_QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x13505e);
  local_20 = in_RSI + 0x2b0;
  local_28._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin(in_stack_ffffffffffffff68);
  std::vector<QAM,_std::allocator<QAM>_>::end
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_ffffffffffffff68);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (__normal_iterator<const_QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                       in_stack_ffffffffffffff68);
    if (!bVar1) {
      return in_RDI;
    }
    __gnu_cxx::__normal_iterator<const_QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator*
              (&local_28);
    __x = (value_type *)
          std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::count
                    ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (key_type *)in_stack_ffffffffffffff78._M_node);
    if (__x == (value_type *)0x0) {
      in_stack_ffffffffffffff84 = GeneratorInfoBase::Deriv((GeneratorInfoBase *)(in_RSI + 8));
      if (in_stack_ffffffffffffff84 < 1) {
        bVar1 = GeneratorInfoBase::IsFinalAM
                          ((GeneratorInfoBase *)
                           CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff80 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff80);
        if (bVar1) goto LAB_00135167;
      }
      pVar2 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::insert(this_00,__x);
      in_stack_ffffffffffffff78 = pVar2.first._M_node;
      in_stack_ffffffffffffff77 = pVar2.second;
    }
LAB_00135167:
    __gnu_cxx::__normal_iterator<const_QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (&local_28);
  } while( true );
}

Assistant:

QAMSet OSTEI_HRR_Algorithm_Base::GetIntermediates(void) const
{
    QAMSet ret;
    for(const auto & it : amorder_)
    {
        if(!topqam_.count(it) && (info_.Deriv() > 0 || !info_.IsFinalAM(it)))
            ret.insert(it);
    }

    return ret;
}